

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O2

int arkode_butcher_order6p
              (sunrealtype *b,sunrealtype **A1,sunrealtype **A2,sunrealtype *c1,sunrealtype *c2,
              sunrealtype *c3,int s)

{
  int iVar1;
  sunrealtype *z;
  sunrealtype *z_00;
  sunrealtype bAAccc;
  
  z = (sunrealtype *)calloc((long)s,8);
  z_00 = (sunrealtype *)calloc((long)s,8);
  iVar1 = arkode_butcher_vv(c1,c2,s,z);
  if ((((iVar1 == 0) && (iVar1 = arkode_butcher_vv(c3,z,s,z_00), iVar1 == 0)) &&
      (iVar1 = arkode_butcher_mv(A2,z_00,s,z), iVar1 == 0)) &&
     (iVar1 = arkode_butcher_mv(A1,z,s,z_00), iVar1 == 0)) {
    iVar1 = arkode_butcher_dot(b,z_00,s,&bAAccc);
    if (iVar1 != 0) {
      return 0;
    }
    free(z);
    free(z_00);
    return (uint)(ABS(bAAccc + -0.008333333333333333) <= 1.4901161193847656e-08);
  }
  free(z);
  free(z_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6p(sunrealtype* b, sunrealtype** A1,
                                             sunrealtype** A2, sunrealtype* c1,
                                             sunrealtype* c2, sunrealtype* c3,
                                             int s)
{
  sunrealtype bAAccc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c1, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c3, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bAAccc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bAAccc - SUN_RCONST(1.0) / SUN_RCONST(120.0)) > TOL) ? SUNFALSE
                                                                       : SUNTRUE;
}